

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewrite.h
# Opt level: O1

FastPattern * trieste::detail::FastPattern::match_pred(void)

{
  FastPattern *in_RDI;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_68;
  set<trieste::Token,_std::less<trieste::Token>,_std::allocator<trieste::Token>_> local_38;
  
  local_38._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_38._M_t._M_impl.super__Rb_tree_header._M_header;
  local_38._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_38._M_t._M_impl._0_8_ = 0;
  local_38._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_38._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_38._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_t._M_impl.super__Rb_tree_header._M_header;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_t._M_impl._0_8_ = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_38._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  FastPattern(in_RDI,&local_38,&local_68,true);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_68);
  std::
  _Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
  ::~_Rb_tree((_Rb_tree<trieste::Token,_trieste::Token,_std::_Identity<trieste::Token>,_std::less<trieste::Token>,_std::allocator<trieste::Token>_>
               *)&local_38);
  return in_RDI;
}

Assistant:

static FastPattern match_pred()
      {
        return FastPattern({}, {}, true);
      }